

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinLaplace_picard_bnd.c
# Opt level: O2

int jac(N_Vector u,N_Vector f,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = 0;
  for (lVar3 = 0; lVar3 != 0x1f; lVar3 = lVar3 + 1) {
    for (lVar2 = 0; lVar2 != 0x1f; lVar2 = lVar2 + 1) {
      puVar1 = (undefined8 *)SUNBandMatrix_Column(J,lVar4 + lVar2);
      *puVar1 = 0xc0b0000000000000;
      if ((lVar2 == 0x1e) || (puVar1[1] = 0x4090000000000000, lVar2 != 0)) {
        puVar1[-1] = 0x4090000000000000;
      }
      if ((lVar3 == 0x1e) || (puVar1[0x1f] = 0x4090000000000000, lVar3 != 0)) {
        puVar1[-0x1f] = 0x4090000000000000;
      }
    }
    lVar4 = lVar4 + 0x1f;
  }
  return 0;
}

Assistant:

static int jac(N_Vector u, N_Vector f, SUNMatrix J, void* user_data,
               N_Vector tmp1, N_Vector tmp2)
{
  sunrealtype dx, dy;
  sunrealtype hdc, vdc;
  sunrealtype* kthCol;

  int i, j, k;

  dx  = ONE / (NX + 1);
  dy  = ONE / (NY + 1);
  hdc = ONE / (dx * dx);
  vdc = ONE / (dy * dy);

  /*
     The components of f(t,u) which depend on u_{i,j} are
     f_{i,j}, f_{i-1,j}, f_{i+1,j}, f_{i,j+1}, and f_{i,j-1}.
     Thus, a column of the Jacobian will contain an entry from
     each of these equations exception the ones on the boundary.

     f_{i,j}   = hdc*(u_{i-1,j}  -2u_{i,j}  +u_{i+1,j})   + vdc*(u_{i,j-1}  -2u_{i,j}  +u_{i,j+1})
     f_{i-1,j} = hdc*(u_{i-2,j}  -2u_{i-1,j}+u_{i,j})     + vdc*(u_{i-1,j-1}-2u_{i-1,j}+u_{i-1,j+1})
     f_{i+1,j} = hdc*(u_{i,j}    -2u_{i+1,j}+u_{i+2,j})   + vdc*(u_{i+1,j-1}-2u_{i+1,j}+u_{i+1,j+1})
     f_{i,j-1} = hdc*(u_{i-1,j-1}-2u_{i,j-1}+u_{i+1,j-1}) + vdc*(u_{i,j-2}  -2u_{i,j-1}+u_{i,j})
     f_{i,j+1} = hdc*(u_{i-1,j+1}-2u_{i,j+1}+u_{i+1,j+1}) + vdc*(u_{i,j}    -2u_{i,j+1}+u_{i,j+2})
  */

  for (j = 0; j <= NY - 1; j++)
  {
    for (i = 0; i <= NX - 1; i++)
    {
      /* Evaluate diffusion coefficients */

      k                                 = i + j * NX;
      kthCol                            = SUNBandMatrix_Column(J, k);
      SM_COLUMN_ELEMENT_B(kthCol, k, k) = -2.0 * hdc - 2.0 * vdc;
      if (i != (NX - 1)) { SM_COLUMN_ELEMENT_B(kthCol, k + 1, k) = hdc; }
      if (i != 0) { SM_COLUMN_ELEMENT_B(kthCol, k - 1, k) = hdc; }
      if (j != (NY - 1)) { SM_COLUMN_ELEMENT_B(kthCol, k + NX, k) = vdc; }
      if (j != 0) { SM_COLUMN_ELEMENT_B(kthCol, k - NX, k) = vdc; }
    }
  }

  return (0);
}